

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_B_upper.c
# Opt level: O3

void test_option_B_upper(void)

{
  wchar_t wVar1;
  int iVar2;
  stat_conflict st;
  stat local_c0;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_B_upper.c"
                      ,L'\x11',"file",L'Ƥ',L'\xffffffff',(void *)0x0);
  wVar1 = systemf("echo file | %s -o > small.cpio 2>small.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_B_upper.c"
                      ,L'\x15',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_B_upper.c"
             ,L'\x16',"1 block\n","small.err");
  iVar2 = stat("small.cpio",&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_B_upper.c"
                      ,L'\x17',0,"0",(long)iVar2,"stat(\"small.cpio\", &st)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_B_upper.c"
                      ,L'\x18',0x200,"512",local_c0.st_size,"st.st_size",(void *)0x0);
  wVar1 = systemf("echo file | %s -oB > large.cpio 2>large.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_B_upper.c"
                      ,L'\x1c',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_B_upper.c"
             ,L'\x1d',"1 block\n","large.err");
  iVar2 = stat("large.cpio",&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_B_upper.c"
                      ,L'\x1e',0,"0",(long)iVar2,"stat(\"large.cpio\", &st)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_B_upper.c"
                      ,L'\x1f',0x1400,"5120",local_c0.st_size,"st.st_size",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_option_B_upper)
{
	struct stat st;
	int r;

	/*
	 * Create a file on disk.
	 */
	assertMakeFile("file", 0644, NULL);

	/* Create an archive without -B; this should be 512 bytes. */
	r = systemf("echo file | %s -o > small.cpio 2>small.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "small.err");
	assertEqualInt(0, stat("small.cpio", &st));
	assertEqualInt(512, st.st_size);

	/* Create an archive with -B; this should be 5120 bytes. */
	r = systemf("echo file | %s -oB > large.cpio 2>large.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "large.err");
	assertEqualInt(0, stat("large.cpio", &st));
	assertEqualInt(5120, st.st_size);
}